

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprError *
anon_unknown.dwarf_9fd58::ReportExpected
          (ExpressionContext *ctx,SynBase *source,TypeBase *type,char *msg,...)

{
  char in_AL;
  int iVar1;
  undefined4 extraout_var;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  __va_list_tag local_e8;
  undefined1 local_c8 [32];
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  ExprError *pEVar2;
  
  local_e8.reg_save_area = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_e8.overflow_arg_area = &args[0].overflow_arg_area;
  local_e8.gp_offset = 0x20;
  local_e8.fp_offset = 0x30;
  local_a8 = in_R8;
  local_a0 = in_R9;
  ReportAt(ctx,source,(source->pos).begin,msg,&local_e8);
  iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
  pEVar2 = (ExprError *)CONCAT44(extraout_var,iVar1);
  (pEVar2->super_ExprBase).typeID = 0;
  (pEVar2->super_ExprBase).source = source;
  (pEVar2->super_ExprBase).type = type;
  (pEVar2->super_ExprBase).next = (ExprBase *)0x0;
  (pEVar2->super_ExprBase).listed = false;
  (pEVar2->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprError_00229b38;
  (pEVar2->values).allocator = (Allocator *)0x0;
  (pEVar2->values).data = (pEVar2->values).little;
  (pEVar2->values).count = 0;
  (pEVar2->values).max = 4;
  return pEVar2;
}

Assistant:

ExprError* ReportExpected(ExpressionContext &ctx, SynBase *source, TypeBase *type, const char *msg, ...)
	{
		va_list args;
		va_start(args, msg);

		ReportAt(ctx, source, source->pos.begin, msg, args);

		va_end(args);

		return new (ctx.get<ExprError>()) ExprError(source, type);
	}